

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int memdbEnlarge(MemStore *p,sqlite3_int64 newSz)

{
  uchar *puVar1;
  uchar *pNew;
  sqlite3_int64 newSz_local;
  MemStore *p_local;
  
  if (((p->mFlags & 2) == 0) || (0 < p->nMmap)) {
    p_local._4_4_ = 0xd;
  }
  else if (p->szMax < newSz) {
    p_local._4_4_ = 0xd;
  }
  else {
    pNew = (uchar *)(newSz << 1);
    if (p->szMax < (long)pNew) {
      pNew = (uchar *)p->szMax;
    }
    puVar1 = (uchar *)sqlite3Realloc(p->aData,(u64)pNew);
    if (puVar1 == (uchar *)0x0) {
      p_local._4_4_ = 0xc0a;
    }
    else {
      p->aData = puVar1;
      p->szAlloc = (sqlite3_int64)pNew;
      p_local._4_4_ = 0;
    }
  }
  return p_local._4_4_;
}

Assistant:

static int memdbEnlarge(MemStore *p, sqlite3_int64 newSz){
  unsigned char *pNew;
  if( (p->mFlags & SQLITE_DESERIALIZE_RESIZEABLE)==0 || NEVER(p->nMmap>0) ){
    return SQLITE_FULL;
  }
  if( newSz>p->szMax ){
    return SQLITE_FULL;
  }
  newSz *= 2;
  if( newSz>p->szMax ) newSz = p->szMax;
  pNew = sqlite3Realloc(p->aData, newSz);
  if( pNew==0 ) return SQLITE_IOERR_NOMEM;
  p->aData = pNew;
  p->szAlloc = newSz;
  return SQLITE_OK;
}